

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CiA402DeviceICanbus.cpp
# Opt level: O0

long __thiscall CiA402DeviceICanbus::c2co(CiA402DeviceICanbus *this,can_msg *input,co_msg *output)

{
  int local_24;
  int i;
  co_msg *output_local;
  can_msg *input_local;
  CiA402DeviceICanbus *this_local;
  
  output->dlc_co = (input->field_0).fi & 0xf;
  (output->field_0).id_co = (unsigned_short)input->id;
  (output->field_0).id_co = (output->field_0).id_co << 1;
  (output->field_0).id_co =
       (output->field_0).id_co & 0xfffe | (ushort)((byte)((input->field_0).fi >> 4) & 1);
  output->ts = input->ts;
  for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
    output->data_co[local_24] = input->data[local_24];
  }
  return 0;
}

Assistant:

long CiA402DeviceICanbus::c2co(const can_msg & input, co_msg & output)
{

   //verificar el bit de start to frame de can

    output.dlc_co=input.dlc;
    output.id_co=input.id;
    output.id_co<<=1;
    output.rtr=input.rtr;
    output.ts=input.ts;


    for( int i=0; i < 8; i++)
    {
        output.data_co[i] = input.data[i];
    }

    return 0;
}